

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# full_toc.c
# Opt level: O0

uint8_t cueify_full_toc_get_session_type(cueify_full_toc *t,uint8_t session)

{
  cueify_full_toc_private *toc;
  uint8_t session_local;
  cueify_full_toc *t_local;
  
  if (t == (cueify_full_toc *)0x0) {
    t_local._7_1_ = '\0';
  }
  else if ((session < *(byte *)t) || (*(byte *)((long)t + 1) < session)) {
    t_local._7_1_ = '\0';
  }
  else {
    t_local._7_1_ = *(uint8_t *)((long)t + (ulong)session * 0x21 + 0x38a);
  }
  return t_local._7_1_;
}

Assistant:

uint8_t cueify_full_toc_get_session_type(cueify_full_toc *t, uint8_t session) {
    cueify_full_toc_private *toc = (cueify_full_toc_private *)t;

    if (toc == NULL) {
	return 0;
    } else if (session >= toc->first_session_number &&
	       session <= toc->last_session_number) {
	return toc->sessions[session].session_type;
    } else {
	return 0;
    }
}